

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall kj::str<unsigned_int&>(String *__return_storage_ptr__,kj *this,uint *params)

{
  CappedArray<char,_14UL> *params_00;
  CappedArray<char,_14UL> CStack_28;
  
  toCharSequence<unsigned_int&>(&CStack_28,this,params);
  _::concat<kj::CappedArray<char,14ul>>(__return_storage_ptr__,(_ *)&CStack_28,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}